

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

Pattern * __thiscall OrPattern::doOr(OrPattern *this,Pattern *b,int4 sa)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference ppDVar3;
  undefined4 extraout_var_01;
  size_type sVar4;
  reference ppDVar5;
  OrPattern *this_00;
  long local_c8;
  OrPattern *tmpor;
  value_type pDStack_a0;
  int4 i;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_98;
  DisjointPattern **local_90;
  value_type local_88;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_80;
  DisjointPattern **local_78;
  value_type local_60;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_58;
  DisjointPattern **local_50;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_48;
  const_iterator iter;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> newlist;
  OrPattern *b2;
  int4 sa_local;
  Pattern *b_local;
  OrPattern *this_local;
  
  if (b == (Pattern *)0x0) {
    local_c8 = 0;
  }
  else {
    local_c8 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
  }
  std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::vector
            ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter);
  __gnu_cxx::
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  ::__normal_iterator(&local_48);
  local_50 = (DisjointPattern **)
             std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                       (&this->orlist);
  local_48._M_current = local_50;
  while( true ) {
    local_58._M_current =
         (DisjointPattern **)
         std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end(&this->orlist);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_58);
    if (!bVar1) break;
    ppDVar3 = __gnu_cxx::
              __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
              ::operator*(&local_48);
    iVar2 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[2])();
    local_60 = (value_type)CONCAT44(extraout_var,iVar2);
    std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::push_back
              ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter,&local_60);
    __gnu_cxx::
    __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
    ::operator++(&local_48);
  }
  if (sa < 0) {
    local_78 = (DisjointPattern **)
               std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                         (&this->orlist);
    local_48._M_current = local_78;
    while( true ) {
      local_80._M_current =
           (DisjointPattern **)
           std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end(&this->orlist);
      bVar1 = __gnu_cxx::operator!=(&local_48,&local_80);
      if (!bVar1) break;
      ppDVar3 = __gnu_cxx::
                __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                ::operator*(&local_48);
      (*((*ppDVar3)->super_Pattern)._vptr_Pattern[3])(*ppDVar3,(ulong)(uint)-sa);
      __gnu_cxx::
      __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
      ::operator++(&local_48);
    }
  }
  if (local_c8 == 0) {
    iVar2 = (*b->_vptr_Pattern[2])();
    local_88 = (value_type)CONCAT44(extraout_var_00,iVar2);
    std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::push_back
              ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter,&local_88);
  }
  else {
    local_90 = (DisjointPattern **)
               std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                         ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)
                          (local_c8 + 8));
    local_48._M_current = local_90;
    while( true ) {
      local_98._M_current =
           (DisjointPattern **)
           std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end
                     ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)
                      (local_c8 + 8));
      bVar1 = __gnu_cxx::operator!=(&local_48,&local_98);
      if (!bVar1) break;
      ppDVar3 = __gnu_cxx::
                __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
                ::operator*(&local_48);
      iVar2 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[2])();
      pDStack_a0 = (value_type)CONCAT44(extraout_var_01,iVar2);
      std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::push_back
                ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter,
                 &stack0xffffffffffffff60);
      __gnu_cxx::
      __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
      ::operator++(&local_48);
    }
  }
  if (0 < sa) {
    for (tmpor._4_4_ = 0;
        sVar4 = std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::size
                          ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter),
        (ulong)(long)tmpor._4_4_ < sVar4; tmpor._4_4_ = tmpor._4_4_ + 1) {
      ppDVar5 = std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::operator[]
                          ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter,
                           (long)tmpor._4_4_);
      (*((*ppDVar5)->super_Pattern)._vptr_Pattern[3])(*ppDVar5,(ulong)(uint)sa);
    }
  }
  this_00 = (OrPattern *)operator_new(0x20);
  OrPattern(this_00,(vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter);
  std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::~vector
            ((vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> *)&iter);
  return &this_00->super_Pattern;
}

Assistant:

Pattern *OrPattern::doOr(const Pattern *b,int4 sa) const

{
  const OrPattern *b2 = dynamic_cast<const OrPattern *>(b);
  vector<DisjointPattern *> newlist;
  vector<DisjointPattern *>::const_iterator iter;

  for(iter=orlist.begin();iter!=orlist.end();++iter)
    newlist.push_back((DisjointPattern *)(*iter)->simplifyClone());
  if (sa < 0)
    for(iter=orlist.begin();iter!=orlist.end();++iter)
      (*iter)->shiftInstruction(-sa);

  if (b2 == (const OrPattern *)0)
    newlist.push_back((DisjointPattern *)b->simplifyClone());
  else {
    for(iter=b2->orlist.begin();iter!=b2->orlist.end();++iter)
      newlist.push_back((DisjointPattern *)(*iter)->simplifyClone());
  }
  if (sa > 0)
    for(int4 i=0;i<newlist.size();++i)
      newlist[i]->shiftInstruction(sa);

  OrPattern *tmpor = new OrPattern(newlist);
  return tmpor;
}